

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedSharedMutexTest_RecurseTryLockShared_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_RecurseTryLockShared_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  bool bVar1;
  TypeParam mtx;
  AssertHelper AStack_e8;
  char *local_e0;
  char *local_d8;
  char local_d0 [24];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8 [4];
  shared_mutex_base<yamc::rwlock::ReaderPrefer> local_98;
  
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_98);
  local_d0[0] = '\0';
  local_d0[1] = '\0';
  local_d0[2] = '\0';
  local_d0[3] = '\0';
  local_d0[4] = '\0';
  local_d0[5] = '\0';
  local_d0[6] = '\0';
  local_d0[7] = '\0';
  local_d0[8] = '\0';
  local_d0[9] = '\0';
  local_d0[10] = '\0';
  local_d0[0xb] = '\0';
  local_d0[0xc] = '\0';
  local_d0[0xd] = '\0';
  local_d0[0xe] = '\0';
  local_d0[0xf] = '\0';
  local_d8 = (char *)0x0;
  local_e0 = local_d0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared(&local_98);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  local_d0[0] = '\0';
  local_d0[1] = '\0';
  local_d0[2] = '\0';
  local_d0[3] = '\0';
  local_d0[4] = '\0';
  local_d0[5] = '\0';
  local_d0[6] = '\0';
  local_d0[7] = '\0';
  local_d0[8] = '\0';
  local_d0[9] = '\0';
  local_d0[10] = '\0';
  local_d0[0xb] = '\0';
  local_d0[0xc] = '\0';
  local_d0[0xd] = '\0';
  local_d0[0xe] = '\0';
  local_d0[0xf] = '\0';
  local_d8 = (char *)0x0;
  local_e0 = local_d0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::try_lock_shared(&local_98)
    ;
  }
  std::__cxx11::string::_M_replace((ulong)&local_e0,0,local_d8,0x1c274c);
  testing::Message::Message((Message *)local_b8);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
             ,300,local_e0);
  testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)local_b8);
  testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
  if (local_b8[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_b8[0]._M_head_impl + 8))();
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  local_d0[0] = '\0';
  local_d0[1] = '\0';
  local_d0[2] = '\0';
  local_d0[3] = '\0';
  local_d0[4] = '\0';
  local_d0[5] = '\0';
  local_d0[6] = '\0';
  local_d0[7] = '\0';
  local_d0[8] = '\0';
  local_d0[9] = '\0';
  local_d0[10] = '\0';
  local_d0[0xb] = '\0';
  local_d0[0xc] = '\0';
  local_d0[0xd] = '\0';
  local_d0[0xe] = '\0';
  local_d0[0xf] = '\0';
  local_d8 = (char *)0x0;
  local_e0 = local_d0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared(&local_98);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_98);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, RecurseTryLockShared) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock_shared());
  EXPECT_CHECK_FAILURE(mtx.try_lock_shared());
  ASSERT_NO_THROW(mtx.unlock_shared());
}